

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

uint64 mkvmuxer::EbmlMasterElementSize(uint64 type,uint64 value)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 1;
  lVar2 = 1;
  if ((((0xff < type) && (lVar2 = 2, 0xffff < type)) && (lVar2 = 3, 0xffffff < type)) &&
     (((lVar2 = 4, type >> 0x20 != 0 && (lVar2 = 5, type >> 0x28 != 0)) &&
      (lVar2 = 6, type >> 0x30 != 0)))) {
    lVar2 = 8 - (ulong)(type >> 0x38 == 0);
  }
  if (((0x7e < value) && (lVar1 = 2, 0x3ffe < value)) &&
     ((lVar1 = 3, 0x1ffffe < value &&
      (((lVar1 = 4, 0xffffffe < value && (lVar1 = 5, 0x7fffffffe < value)) &&
       (lVar1 = 6, 0x3fffffffffe < value)))))) {
    lVar1 = 8 - (ulong)(value < 0x1ffffffffffff);
  }
  return lVar1 + lVar2;
}

Assistant:

uint64 EbmlMasterElementSize(uint64 type, uint64 value) {
  // Size of EBML ID
  int32 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += GetCodedUIntSize(value);

  return ebml_size;
}